

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# eepromtool.c
# Opt level: O3

uint16 SIIcrc(uint8 *buf)

{
  byte bVar1;
  byte bVar2;
  int i;
  int iVar3;
  int iVar4;
  bool bVar5;
  
  bVar2 = 0xff;
  iVar3 = 0;
  do {
    bVar2 = bVar2 ^ *buf;
    iVar4 = 8;
    do {
      bVar1 = bVar2 * '\x02';
      bVar5 = -1 < (char)bVar2;
      bVar2 = bVar1 ^ 7;
      if (bVar5) {
        bVar2 = bVar1;
      }
      iVar4 = iVar4 + -1;
    } while (iVar4 != 0);
    buf = buf + 1;
    iVar3 = iVar3 + 1;
  } while (iVar3 != 0xe);
  return (uint16)bVar2;
}

Assistant:

uint16 SIIcrc(uint8 *buf)
{
   int i; 
   uint8 crc;
    
   crc = 0xff; 
   for( i = 0 ; i <= 13 ; i++ )
   {
      calc_crc(&crc , *(buf++));  
   } 
   return (uint16)crc;
}